

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * cmGlobalNinjaGenerator::EncodeLiteral(string *__return_storage_ptr__,string *lit)

{
  string *lit_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)lit);
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,"$","$$");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,"\n","$\n");
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::EncodeLiteral(const std::string& lit)
{
  std::string result = lit;
  cmSystemTools::ReplaceString(result, "$", "$$");
  cmSystemTools::ReplaceString(result, "\n", "$\n");
  return result;
}